

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_http_method_info * get_http_method_info(char *method)

{
  int iVar1;
  mg_http_method_info *local_20;
  mg_http_method_info *m;
  char *method_local;
  
  local_20 = http_methods;
  while( true ) {
    if (local_20->name == (char *)0x0) {
      return (mg_http_method_info *)0x0;
    }
    iVar1 = strcmp(local_20->name,method);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static const struct mg_http_method_info *
get_http_method_info(const char *method)
{
	/* Check if the method is known to the server. The list of all known
	 * HTTP methods can be found here at
	 * http://www.iana.org/assignments/http-methods/http-methods.xhtml
	 */
	const struct mg_http_method_info *m = http_methods;

	while (m->name) {
		if (!strcmp(m->name, method)) {
			return m;
		}
		m++;
	}
	return NULL;
}